

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

CallReaction testing::Mock::GetReactionOnUninterestingCalls(void *mock_obj)

{
  size_type sVar1;
  mapped_type *pmVar2;
  CallReaction CVar3;
  MutexLock l;
  void *mock_obj_local;
  
  l.mutex_ = (MutexBase *)internal::g_gmock_mutex;
  mock_obj_local = mock_obj;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  sVar1 = std::
          map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
          ::count((map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
                   *)(anonymous_namespace)::g_uninteresting_call_reaction,&mock_obj_local);
  if (sVar1 == 0) {
    CVar3 = kWarn;
    if (FLAGS_gmock_default_mock_behavior < (kFail|kWarn)) {
      CVar3 = FLAGS_gmock_default_mock_behavior;
    }
  }
  else {
    pmVar2 = std::
             map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
             ::operator[]((map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
                           *)(anonymous_namespace)::g_uninteresting_call_reaction,&mock_obj_local);
    CVar3 = *pmVar2;
  }
  internal::GTestMutexLock::~GTestMutexLock(&l);
  return CVar3;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  return (g_uninteresting_call_reaction.count(mock_obj) == 0) ?
      internal::intToCallReaction(GMOCK_FLAG(default_mock_behavior)) :
      g_uninteresting_call_reaction[mock_obj];
}